

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

Matrix * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  optimization *this_01;
  Matrix *this_02;
  double *__ptr;
  Index IVar1;
  Index IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_78;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_40;
  
  this_01 = &this->op_;
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01,
             CONCAT44(extraout_var,iVar3) * 2,CONCAT44(extraout_var_00,iVar4));
  this_02 = &(this->op_).CA;
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             CONCAT44(extraout_var_01,iVar3),CONCAT44(extraout_var_02,iVar4));
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::getC((Matrix *)&local_78,&this_00->super_KalmanFilterBase);
  __ptr = (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_78.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data;
  IVar1 = (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar2 = (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_78.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_rows.m_value;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_78.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_cols.m_value;
  local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       __ptr;
  local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = IVar1;
  local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = IVar2;
  free(__ptr);
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_78,&this_01->O,0,0,CONCAT44(extraout_var_03,iVar3),
             CONCAT44(extraout_var_04,iVar4));
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&local_78,this_02);
  KalmanFilterBase::getA((Matrix *)&local_78,&this_00->super_KalmanFilterBase);
  local_40 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_02,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_78);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (this_02,&local_40);
  free(local_78.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data);
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  iVar5 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            (&local_78,&this_01->O,CONCAT44(extraout_var_05,iVar3),0,CONCAT44(extraout_var_06,iVar4)
             ,CONCAT44(extraout_var_07,iVar5));
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&local_78,this_02);
  return &this_01->O;
}

Assistant:

stateObservation::Matrix & ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
{
  op_.O.resize(getMeasurementSize() * 2, getStateSize());
  op_.CA.resize(getMeasurementSize(), getStateSize());
  op_.CA = ekf_.getC();
  op_.O.block(0, 0, getMeasurementSize(), getStateSize()) = op_.CA;
  op_.CA = op_.CA * ekf_.getA();
  op_.O.block(getMeasurementSize(), 0, getMeasurementSize(), getStateSize()) = op_.CA;
  return op_.O;
}